

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

void __thiscall r_exec::CTPX::store_input(CTPX *this,View *input)

{
  P<r_exec::BindingMap> PVar1;
  BindingMap *pBVar2;
  Code *abstraction;
  _Object *p_Var3;
  undefined1 local_68 [8];
  Input i;
  _Fact *abstracted_input;
  P<r_exec::BindingMap> local_28;
  P<r_exec::BindingMap> bm;
  _Fact *input_object;
  View *input_local;
  CTPX *this_local;
  
  bm.object = (_Object *)core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
  pBVar2 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(pBVar2);
  core::P<r_exec::BindingMap>::P(&local_28,pBVar2);
  pBVar2 = core::P<r_exec::BindingMap>::operator->(&local_28);
  abstraction = BindingMap::abstract_object(pBVar2,(Code *)bm.object,false);
  i.ijt = (uint64_t)abstraction;
  pBVar2 = core::P::operator_cast_to_BindingMap_((P *)&local_28);
  Input::Input((Input *)local_68,input,(_Fact *)abstraction,pBVar2);
  r_code::list<r_exec::Input>::push_front(&(this->super__TPX).inputs,(Input *)local_68);
  PVar1 = bm;
  p_Var3 = (_Object *)core::P::operator_cast_to__Fact_((P *)&(this->super__TPX).super_TPX.target);
  if (PVar1.object == p_Var3) {
    this->stored_premise = true;
  }
  Input::~Input((Input *)local_68);
  core::P<r_exec::BindingMap>::~P(&local_28);
  return;
}

Assistant:

void CTPX::store_input(r_exec::View *input)
{
    _Fact *input_object = (_Fact *)input->object;
    P<BindingMap> bm = new BindingMap();
    _Fact *abstracted_input = (_Fact *)bm->abstract_object(input_object, false);
    Input i(input, abstracted_input, bm);
    inputs.push_front(i);

    if (input_object == target) {
        stored_premise = true;
    }
}